

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImWchar_push_back(ImVector_ImWchar *self,ImWchar v)

{
  unsigned_short local_2;
  
  ImVector<unsigned_short>::push_back(self,&local_2);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImWchar_push_back(ImVector_ImWchar* self,const ImWchar v)
{
    return self->push_back(v);
}